

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O2

ParsedIR * __thiscall spirv_cross::ParsedIR::operator=(ParsedIR *this,ParsedIR *other)

{
  uint32_t uVar1;
  MemoryModel MVar2;
  long lVar3;
  
  if (this != other) {
    ::std::
    __uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
    ::operator=((__uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                 *)this,(__uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                         *)other);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&this->spirv,&other->spirv);
    ::std::
    _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::operator=(&(this->meta)._M_h,&(other->meta)._M_h);
    for (lVar3 = 0; lVar3 != 0x310; lVar3 = lVar3 + 0x38) {
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
                ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)
                 (this->ids_for_type[0].stack_storage.aligned_char + lVar3 + -0x18),
                 (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)
                 (other->ids_for_type[0].stack_storage.aligned_char + lVar3 + -0x18));
    }
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
              (&this->ids_for_constant_undef_or_type,&other->ids_for_constant_undef_or_type);
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
              (&this->ids_for_constant_or_variable,&other->ids_for_constant_or_variable);
    SmallVector<spv::Capability,_8UL>::operator=
              (&this->declared_capabilities,&other->declared_capabilities);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::operator=(&this->declared_extensions,&other->declared_extensions);
    SmallVector<unsigned_char,_8UL>::operator=(&this->block_meta,&other->block_meta);
    ::std::
    _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)6>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::operator=(&(this->continue_block_to_loop_header)._M_h,
                &(other->continue_block_to_loop_header)._M_h);
    ::std::
    _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)4>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::operator=(&(this->entry_points)._M_h,&(other->entry_points)._M_h);
    SmallVector<spirv_cross::Variant,_8UL>::operator=(&this->ids,&other->ids);
    MVar2 = other->memory_model;
    this->addressing_model = other->addressing_model;
    this->memory_model = MVar2;
    (this->default_entry_point).id = (other->default_entry_point).id;
    uVar1 = (other->source).version;
    *(undefined4 *)((long)&(this->source).version + 3) =
         *(undefined4 *)((long)&(other->source).version + 3);
    (this->source).version = uVar1;
    uVar1 = other->loop_iteration_depth_soft;
    this->loop_iteration_depth_hard = other->loop_iteration_depth_hard;
    this->loop_iteration_depth_soft = uVar1;
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::operator=(&(this->meta_needing_name_fixup)._M_h,&(other->meta_needing_name_fixup)._M_h);
    ::std::
    _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_unsigned_int>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::operator=(&(this->load_type_width)._M_h,&(other->load_type_width)._M_h);
  }
  return this;
}

Assistant:

ParsedIR &ParsedIR::operator=(ParsedIR &&other) SPIRV_CROSS_NOEXCEPT
{
	if (this != &other)
	{
		pool_group = std::move(other.pool_group);
		spirv = std::move(other.spirv);
		meta = std::move(other.meta);
		for (int i = 0; i < TypeCount; i++)
			ids_for_type[i] = std::move(other.ids_for_type[i]);
		ids_for_constant_undef_or_type = std::move(other.ids_for_constant_undef_or_type);
		ids_for_constant_or_variable = std::move(other.ids_for_constant_or_variable);
		declared_capabilities = std::move(other.declared_capabilities);
		declared_extensions = std::move(other.declared_extensions);
		block_meta = std::move(other.block_meta);
		continue_block_to_loop_header = std::move(other.continue_block_to_loop_header);
		entry_points = std::move(other.entry_points);
		ids = std::move(other.ids);
		addressing_model = other.addressing_model;
		memory_model = other.memory_model;

		default_entry_point = other.default_entry_point;
		source = other.source;
		loop_iteration_depth_hard = other.loop_iteration_depth_hard;
		loop_iteration_depth_soft = other.loop_iteration_depth_soft;

		meta_needing_name_fixup = std::move(other.meta_needing_name_fixup);
		load_type_width = std::move(other.load_type_width);
	}
	return *this;
}